

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statemachine.cc
# Opt level: O3

int ctemplate_htmlparser::statemachine_parse(statemachine_ctx *ctx,char *str,int size)

{
  byte schr;
  char cVar1;
  int iVar2;
  statemachine_definition *psVar3;
  int **ppiVar4;
  ulong uVar5;
  char **ppcVar6;
  int iVar7;
  int iVar8;
  long lVar9;
  char encoded_char [10];
  char local_3a [10];
  
  if (((ctx == (statemachine_ctx *)0x0) ||
      (psVar3 = ctx->definition, psVar3 == (statemachine_definition *)0x0)) ||
     (ppiVar4 = psVar3->transition_table, ppiVar4 == (int **)0x0)) {
    __assert_fail("ctx !=NULL && ctx->definition != NULL && ctx->definition->transition_table != NULL"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/htmlparser/statemachine.cc"
                  ,0x188,
                  "int ctemplate_htmlparser::statemachine_parse(statemachine_ctx *, const char *, int)"
                 );
  }
  if (size < 0) {
    builtin_strncpy(ctx->error_msg,"Negative size in statemachine_parse().",0x27);
LAB_0013180f:
    iVar8 = 0x7f;
  }
  else {
    iVar8 = ctx->current_state;
    if (size != 0) {
      lVar9 = 0;
      do {
        schr = str[lVar9];
        ctx->current_char = schr;
        iVar2 = ppiVar4[iVar8][schr];
        ctx->next_state = iVar2;
        if (iVar2 == 0x7f) {
          statemachine_encode_char(schr,local_3a,10);
          ppcVar6 = ctx->definition->state_names;
          if (ppcVar6 == (char **)0x0) {
            snprintf(ctx->error_msg,0x50,"Unexpected character \'%s\'",local_3a);
          }
          else {
            snprintf(ctx->error_msg,0x50,"Unexpected character \'%s\' in state \'%s\'",local_3a,
                     ppcVar6[ctx->current_state]);
          }
          goto LAB_0013180f;
        }
        if (iVar8 != iVar2) {
          iVar7 = iVar8;
          if (psVar3->exit_state_events[iVar8] != (state_event_function)0x0) {
            (*psVar3->exit_state_events[iVar8])(ctx,iVar8,str[lVar9],iVar2);
            iVar7 = ctx->current_state;
            iVar2 = ctx->next_state;
          }
          iVar8 = iVar2;
          if ((iVar7 != iVar8) && (psVar3->enter_state_events[iVar8] != (state_event_function)0x0))
          {
            (*psVar3->enter_state_events[iVar8])(ctx,iVar7,str[lVar9],iVar8);
            iVar8 = ctx->next_state;
          }
        }
        if (psVar3->in_state_events[iVar8] != (state_event_function)0x0) {
          (*psVar3->in_state_events[iVar8])(ctx,ctx->current_state,str[lVar9],iVar8);
        }
        if ((ctx->recording != 0) && (uVar5 = ctx->record_pos, uVar5 < 0xff)) {
          cVar1 = str[lVar9];
          ctx->record_pos = uVar5 + 1;
          ctx->record_buffer[uVar5] = cVar1;
          ctx->record_buffer[ctx->record_pos] = '\0';
        }
        iVar8 = ctx->next_state;
        ctx->current_state = iVar8;
        ctx->column_number = ctx->column_number + 1;
        if (str[lVar9] == '\n') {
          ctx->line_number = ctx->line_number + 1;
          ctx->column_number = 1;
        }
        lVar9 = lVar9 + 1;
      } while (size != (int)lVar9);
    }
  }
  return iVar8;
}

Assistant:

int statemachine_parse(statemachine_ctx *ctx, const char *str, int size)
{
    int i;
    const int* const* state_table = ctx->definition->transition_table;
    statemachine_definition *def;

    assert(ctx !=NULL &&
           ctx->definition != NULL &&
           ctx->definition->transition_table != NULL);

    if (size < 0) {
        snprintf(ctx->error_msg, STATEMACHINE_MAX_STR_ERROR, "%s",
                 "Negative size in statemachine_parse().");
        return STATEMACHINE_ERROR;
    }

    def = ctx->definition;

    for (i = 0; i < size; i++) {
        ctx->current_char = *str;
        ctx->next_state =
            state_table[ctx->current_state][CAST(unsigned char, *str)];
        if (ctx->next_state == STATEMACHINE_ERROR) {
            statemachine_set_transition_error_message(ctx);
            return STATEMACHINE_ERROR;
        }

        if (ctx->current_state != ctx->next_state) {
            if (def->exit_state_events[ctx->current_state])
                def->exit_state_events[ctx->current_state](ctx,
                                                           ctx->current_state,
                                                           *str,
                                                           ctx->next_state);
        }
        if (ctx->current_state != ctx->next_state) {
            if (def->enter_state_events[ctx->next_state])
                def->enter_state_events[ctx->next_state](ctx,
                                                         ctx->current_state,
                                                         *str,
                                                         ctx->next_state);
        }

        if (def->in_state_events[ctx->next_state])
            def->in_state_events[ctx->next_state](ctx,
                                                  ctx->current_state,
                                                  *str,
                                                  ctx->next_state);

        /* We need two bytes left so we can NULL terminate the string. */
        if (ctx->recording &&
            STATEMACHINE_RECORD_BUFFER_SIZE - 1 > ctx->record_pos) {
            ctx->record_buffer[ctx->record_pos++] = *str;
            ctx->record_buffer[ctx->record_pos] = '\0';
        }

/* TODO(falmeida): Should clarify the contract here, since an event can change
 * ctx->next_state and we need this functionality */

        ctx->current_state = ctx->next_state;
        ctx->column_number++;

        if (*str == '\n') {
          ctx->line_number++;
          ctx->column_number = 1;
        }
        str++;
    }

    return ctx->current_state;
}